

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O2

int __thiscall QSimplex::findPivotColumn(QSimplex *this)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  double dVar5;
  
  iVar3 = 1;
  if (1 < this->columns) {
    iVar3 = this->columns;
  }
  uVar2 = 0xffffffffffffffff;
  dVar5 = 0.0;
  for (uVar4 = 0; iVar3 - 1 != uVar4; uVar4 = uVar4 + 1) {
    dVar1 = this->matrix[uVar4];
    if (dVar1 < dVar5) {
      uVar2 = uVar4;
    }
    uVar2 = uVar2 & 0xffffffff;
    if (dVar5 <= dVar1) {
      dVar1 = dVar5;
    }
    dVar5 = dVar1;
  }
  return (int)uVar2;
}

Assistant:

int QSimplex::findPivotColumn()
{
    qreal min = 0;
    int minIndex = -1;

    for (int j = 0; j < columns-1; ++j) {
        if (valueAt(0, j) < min) {
            min = valueAt(0, j);
            minIndex = j;
        }
    }

    return minIndex;
}